

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void HistogramSetRemoveHistogram(VP8LHistogramSet *set,int i,int *num_used)

{
  bool bVar1;
  uint uVar2;
  
  set->histograms[i] = (VP8LHistogram *)0x0;
  *num_used = *num_used + -1;
  if ((set->size + -1 == i) && (0 < set->size)) {
    uVar2 = set->size;
    do {
      if (set->histograms[(ulong)uVar2 - 1] != (VP8LHistogram *)0x0) {
        return;
      }
      set->size = uVar2 - 1;
      bVar1 = 1 < (int)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  return;
}

Assistant:

static void HistogramSetRemoveHistogram(VP8LHistogramSet* const set, int i,
                                        int* const num_used) {
  assert(set->histograms[i] != NULL);
  set->histograms[i] = NULL;
  --*num_used;
  // If we remove the last valid one, shrink until the next valid one.
  if (i == set->size - 1) {
    while (set->size >= 1 && set->histograms[set->size - 1] == NULL) {
      --set->size;
    }
  }
}